

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O2

uint8 * __thiscall
google::protobuf::internal::ExtensionSet::Extension::InternalSerializeFieldWithCachedSizesToArray
          (Extension *this,int number,bool deterministic,uint8 *target)

{
  MessageLite *value;
  Type TVar1;
  uint8 *puVar2;
  LogMessage *other;
  Type *pTVar3;
  Type *pTVar4;
  int *piVar5;
  uint *puVar6;
  uint64 *puVar7;
  double *pdVar8;
  unsigned_long *puVar9;
  bool *pbVar10;
  float *pfVar11;
  long *plVar12;
  undefined4 extraout_var;
  int i;
  int iVar13;
  int i_20;
  int i_14;
  LogFinisher local_61;
  LogMessage local_60;
  
  if (this->is_repeated == true) {
    if (this->is_packed == true) {
      if (this->cached_size != 0) {
        puVar2 = WireFormatLite::WriteTagToArray(number,WIRETYPE_LENGTH_DELIMITED,target);
        target = io::CodedOutputStream::WriteVarint32SignExtendedToArray(this->cached_size,puVar2);
        TVar1 = real_type(this->type);
        switch(TVar1) {
        case TYPE_DOUBLE:
          for (iVar13 = 0; iVar13 < ((this->field_0).repeated_double_value)->current_size_;
              iVar13 = iVar13 + 1) {
            pdVar8 = RepeatedField<double>::Get((this->field_0).repeated_double_value,iVar13);
            *(double *)target = *pdVar8;
            target = (uint8 *)((long)target + 8);
          }
          break;
        case TYPE_FLOAT:
          for (iVar13 = 0; iVar13 < ((this->field_0).repeated_float_value)->current_size_;
              iVar13 = iVar13 + 1) {
            pfVar11 = RepeatedField<float>::Get((this->field_0).repeated_float_value,iVar13);
            *(float *)target = *pfVar11;
            target = (uint8 *)((long)target + 4);
          }
          break;
        case TYPE_INT64:
          for (iVar13 = 0; iVar13 < ((this->field_0).repeated_int64_value)->current_size_;
              iVar13 = iVar13 + 1) {
            puVar7 = (uint64 *)RepeatedField<long>::Get((this->field_0).repeated_int64_value,iVar13)
            ;
            target = io::CodedOutputStream::WriteVarint64ToArray(*puVar7,target);
          }
          break;
        case TYPE_UINT64:
          for (iVar13 = 0; iVar13 < ((this->field_0).repeated_uint64_value)->current_size_;
              iVar13 = iVar13 + 1) {
            puVar9 = RepeatedField<unsigned_long>::Get((this->field_0).repeated_uint64_value,iVar13)
            ;
            target = io::CodedOutputStream::WriteVarint64ToArray(*puVar9,target);
          }
          break;
        case TYPE_INT32:
          for (iVar13 = 0; iVar13 < ((this->field_0).repeated_int32_value)->current_size_;
              iVar13 = iVar13 + 1) {
            piVar5 = RepeatedField<int>::Get((this->field_0).repeated_int32_value,iVar13);
            target = io::CodedOutputStream::WriteVarint32SignExtendedToArray(*piVar5,target);
          }
          break;
        case TYPE_FIXED64:
          for (iVar13 = 0; iVar13 < ((this->field_0).repeated_uint64_value)->current_size_;
              iVar13 = iVar13 + 1) {
            pdVar8 = (double *)
                     RepeatedField<unsigned_long>::Get((this->field_0).repeated_uint64_value,iVar13)
            ;
            *(double *)target = *pdVar8;
            target = (uint8 *)((long)target + 8);
          }
          break;
        case TYPE_FIXED32:
          for (iVar13 = 0; iVar13 < ((this->field_0).repeated_uint32_value)->current_size_;
              iVar13 = iVar13 + 1) {
            puVar6 = RepeatedField<unsigned_int>::Get((this->field_0).repeated_uint32_value,iVar13);
            *(uint *)target = *puVar6;
            target = (uint8 *)((long)target + 4);
          }
          break;
        case TYPE_BOOL:
          for (iVar13 = 0; iVar13 < ((this->field_0).repeated_bool_value)->current_size_;
              iVar13 = iVar13 + 1) {
            pbVar10 = RepeatedField<bool>::Get((this->field_0).repeated_bool_value,iVar13);
            target = WireFormatLite::WriteBoolNoTagToArray(*pbVar10,target);
          }
          break;
        case TYPE_STRING:
        case TYPE_GROUP:
        case TYPE_MESSAGE:
        case TYPE_BYTES:
          LogMessage::LogMessage
                    (&local_60,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set_heavy.cc"
                     ,0x1f0);
          other = LogMessage::operator<<(&local_60,"Non-primitive types can\'t be packed.");
          LogFinisher::operator=(&local_61,other);
          LogMessage::~LogMessage(&local_60);
          break;
        case TYPE_UINT32:
          for (iVar13 = 0; iVar13 < ((this->field_0).repeated_uint32_value)->current_size_;
              iVar13 = iVar13 + 1) {
            puVar6 = RepeatedField<unsigned_int>::Get((this->field_0).repeated_uint32_value,iVar13);
            target = io::CodedOutputStream::WriteVarint32ToArray(*puVar6,target);
          }
          break;
        case TYPE_ENUM:
          for (iVar13 = 0; iVar13 < ((this->field_0).repeated_int32_value)->current_size_;
              iVar13 = iVar13 + 1) {
            piVar5 = RepeatedField<int>::Get((this->field_0).repeated_int32_value,iVar13);
            target = io::CodedOutputStream::WriteVarint32SignExtendedToArray(*piVar5,target);
          }
          break;
        case TYPE_SFIXED32:
          for (iVar13 = 0; iVar13 < ((this->field_0).repeated_int32_value)->current_size_;
              iVar13 = iVar13 + 1) {
            piVar5 = RepeatedField<int>::Get((this->field_0).repeated_int32_value,iVar13);
            *(int *)target = *piVar5;
            target = (uint8 *)((long)target + 4);
          }
          break;
        case TYPE_SFIXED64:
          for (iVar13 = 0; iVar13 < ((this->field_0).repeated_int64_value)->current_size_;
              iVar13 = iVar13 + 1) {
            pdVar8 = (double *)RepeatedField<long>::Get((this->field_0).repeated_int64_value,iVar13)
            ;
            *(double *)target = *pdVar8;
            target = (uint8 *)((long)target + 8);
          }
          break;
        case TYPE_SINT32:
          for (iVar13 = 0; iVar13 < ((this->field_0).repeated_int32_value)->current_size_;
              iVar13 = iVar13 + 1) {
            piVar5 = RepeatedField<int>::Get((this->field_0).repeated_int32_value,iVar13);
            target = WireFormatLite::WriteSInt32NoTagToArray(*piVar5,target);
          }
          break;
        case MAX_TYPE:
          for (iVar13 = 0; iVar13 < ((this->field_0).repeated_int64_value)->current_size_;
              iVar13 = iVar13 + 1) {
            plVar12 = RepeatedField<long>::Get((this->field_0).repeated_int64_value,iVar13);
            target = WireFormatLite::WriteSInt64NoTagToArray(*plVar12,target);
          }
        }
      }
    }
    else {
      TVar1 = real_type(this->type);
      switch(TVar1) {
      case TYPE_DOUBLE:
        for (iVar13 = 0; iVar13 < ((this->field_0).repeated_double_value)->current_size_;
            iVar13 = iVar13 + 1) {
          pdVar8 = RepeatedField<double>::Get((this->field_0).repeated_double_value,iVar13);
          target = WireFormatLite::WriteDoubleToArray(number,*pdVar8,target);
        }
        break;
      case TYPE_FLOAT:
        for (iVar13 = 0; iVar13 < ((this->field_0).repeated_float_value)->current_size_;
            iVar13 = iVar13 + 1) {
          pfVar11 = RepeatedField<float>::Get((this->field_0).repeated_float_value,iVar13);
          target = WireFormatLite::WriteFloatToArray(number,*pfVar11,target);
        }
        break;
      case TYPE_INT64:
        for (iVar13 = 0; iVar13 < ((this->field_0).repeated_int64_value)->current_size_;
            iVar13 = iVar13 + 1) {
          plVar12 = RepeatedField<long>::Get((this->field_0).repeated_int64_value,iVar13);
          target = WireFormatLite::WriteInt64ToArray(number,*plVar12,target);
        }
        break;
      case TYPE_UINT64:
        for (iVar13 = 0; iVar13 < ((this->field_0).repeated_uint64_value)->current_size_;
            iVar13 = iVar13 + 1) {
          puVar9 = RepeatedField<unsigned_long>::Get((this->field_0).repeated_uint64_value,iVar13);
          target = WireFormatLite::WriteUInt64ToArray(number,*puVar9,target);
        }
        break;
      case TYPE_INT32:
        for (iVar13 = 0; iVar13 < ((this->field_0).repeated_int32_value)->current_size_;
            iVar13 = iVar13 + 1) {
          piVar5 = RepeatedField<int>::Get((this->field_0).repeated_int32_value,iVar13);
          target = WireFormatLite::WriteInt32ToArray(number,*piVar5,target);
        }
        break;
      case TYPE_FIXED64:
        for (iVar13 = 0; iVar13 < ((this->field_0).repeated_uint64_value)->current_size_;
            iVar13 = iVar13 + 1) {
          puVar9 = RepeatedField<unsigned_long>::Get((this->field_0).repeated_uint64_value,iVar13);
          target = WireFormatLite::WriteFixed64ToArray(number,*puVar9,target);
        }
        break;
      case TYPE_FIXED32:
        for (iVar13 = 0; iVar13 < ((this->field_0).repeated_uint32_value)->current_size_;
            iVar13 = iVar13 + 1) {
          puVar6 = RepeatedField<unsigned_int>::Get((this->field_0).repeated_uint32_value,iVar13);
          target = WireFormatLite::WriteFixed32ToArray(number,*puVar6,target);
        }
        break;
      case TYPE_BOOL:
        for (iVar13 = 0; iVar13 < ((this->field_0).repeated_bool_value)->current_size_;
            iVar13 = iVar13 + 1) {
          pbVar10 = RepeatedField<bool>::Get((this->field_0).repeated_bool_value,iVar13);
          target = WireFormatLite::WriteBoolToArray(number,*pbVar10,target);
        }
        break;
      case TYPE_STRING:
        for (iVar13 = 0; iVar13 < (int)((this->field_0).string_value)->_M_string_length;
            iVar13 = iVar13 + 1) {
          pTVar3 = RepeatedPtrFieldBase::
                   Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                             ((RepeatedPtrFieldBase *)(this->field_0).string_value,iVar13);
          target = WireFormatLite::WriteStringToArray(number,pTVar3,target);
        }
        break;
      case TYPE_GROUP:
        for (iVar13 = 0; iVar13 < (int)((this->field_0).string_value)->_M_string_length;
            iVar13 = iVar13 + 1) {
          pTVar4 = RepeatedPtrFieldBase::
                   Get<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>::TypeHandler>
                             ((RepeatedPtrFieldBase *)(this->field_0).string_value,iVar13);
          target = WireFormatLite::InternalWriteGroupToArray(number,pTVar4,deterministic,target);
        }
        break;
      case TYPE_MESSAGE:
        for (iVar13 = 0; iVar13 < (int)((this->field_0).string_value)->_M_string_length;
            iVar13 = iVar13 + 1) {
          pTVar4 = RepeatedPtrFieldBase::
                   Get<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>::TypeHandler>
                             ((RepeatedPtrFieldBase *)(this->field_0).string_value,iVar13);
          target = WireFormatLite::InternalWriteMessageToArray(number,pTVar4,deterministic,target);
        }
        break;
      case TYPE_BYTES:
        for (iVar13 = 0; iVar13 < (int)((this->field_0).string_value)->_M_string_length;
            iVar13 = iVar13 + 1) {
          pTVar3 = RepeatedPtrFieldBase::
                   Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                             ((RepeatedPtrFieldBase *)(this->field_0).string_value,iVar13);
          target = WireFormatLite::WriteBytesToArray(number,pTVar3,target);
        }
        break;
      case TYPE_UINT32:
        for (iVar13 = 0; iVar13 < ((this->field_0).repeated_uint32_value)->current_size_;
            iVar13 = iVar13 + 1) {
          puVar6 = RepeatedField<unsigned_int>::Get((this->field_0).repeated_uint32_value,iVar13);
          target = WireFormatLite::WriteUInt32ToArray(number,*puVar6,target);
        }
        break;
      case TYPE_ENUM:
        for (iVar13 = 0; iVar13 < ((this->field_0).repeated_int32_value)->current_size_;
            iVar13 = iVar13 + 1) {
          piVar5 = RepeatedField<int>::Get((this->field_0).repeated_int32_value,iVar13);
          target = WireFormatLite::WriteEnumToArray(number,*piVar5,target);
        }
        break;
      case TYPE_SFIXED32:
        for (iVar13 = 0; iVar13 < ((this->field_0).repeated_int32_value)->current_size_;
            iVar13 = iVar13 + 1) {
          piVar5 = RepeatedField<int>::Get((this->field_0).repeated_int32_value,iVar13);
          target = WireFormatLite::WriteSFixed32ToArray(number,*piVar5,target);
        }
        break;
      case TYPE_SFIXED64:
        for (iVar13 = 0; iVar13 < ((this->field_0).repeated_int64_value)->current_size_;
            iVar13 = iVar13 + 1) {
          plVar12 = RepeatedField<long>::Get((this->field_0).repeated_int64_value,iVar13);
          target = WireFormatLite::WriteSFixed64ToArray(number,*plVar12,target);
        }
        break;
      case TYPE_SINT32:
        for (iVar13 = 0; iVar13 < ((this->field_0).repeated_int32_value)->current_size_;
            iVar13 = iVar13 + 1) {
          piVar5 = RepeatedField<int>::Get((this->field_0).repeated_int32_value,iVar13);
          target = WireFormatLite::WriteSInt32ToArray(number,*piVar5,target);
        }
        break;
      case MAX_TYPE:
        for (iVar13 = 0; iVar13 < ((this->field_0).repeated_int64_value)->current_size_;
            iVar13 = iVar13 + 1) {
          plVar12 = RepeatedField<long>::Get((this->field_0).repeated_int64_value,iVar13);
          target = WireFormatLite::WriteSInt64ToArray(number,*plVar12,target);
        }
      }
    }
  }
  else if ((this->field_0xa & 1) == 0) {
    TVar1 = real_type(this->type);
    switch(TVar1) {
    case TYPE_DOUBLE:
      puVar2 = WireFormatLite::WriteDoubleToArray(number,(this->field_0).double_value,target);
      return puVar2;
    case TYPE_FLOAT:
      puVar2 = WireFormatLite::WriteFloatToArray(number,(this->field_0).float_value,target);
      return puVar2;
    case TYPE_INT64:
      puVar2 = WireFormatLite::WriteInt64ToArray(number,(this->field_0).int64_value,target);
      return puVar2;
    case TYPE_UINT64:
      puVar2 = WireFormatLite::WriteUInt64ToArray(number,(this->field_0).uint64_value,target);
      return puVar2;
    case TYPE_INT32:
      puVar2 = WireFormatLite::WriteInt32ToArray(number,(this->field_0).int32_value,target);
      return puVar2;
    case TYPE_FIXED64:
      puVar2 = WireFormatLite::WriteFixed64ToArray(number,(this->field_0).uint64_value,target);
      return puVar2;
    case TYPE_FIXED32:
      puVar2 = WireFormatLite::WriteFixed32ToArray(number,(this->field_0).uint32_value,target);
      return puVar2;
    case TYPE_BOOL:
      puVar2 = WireFormatLite::WriteBoolToArray(number,(this->field_0).bool_value,target);
      return puVar2;
    case TYPE_STRING:
      puVar2 = WireFormatLite::WriteStringToArray(number,(this->field_0).string_value,target);
      return puVar2;
    case TYPE_GROUP:
      puVar2 = WireFormatLite::WriteGroupToArray(number,(this->field_0).message_value,target);
      return puVar2;
    case TYPE_MESSAGE:
      value = (this->field_0).message_value;
      if ((this->field_0xa & 0x10) != 0) {
        iVar13 = (*value->_vptr_MessageLite[0x11])(value,number,deterministic,target);
        return (uint8 *)CONCAT44(extraout_var,iVar13);
      }
      puVar2 = WireFormatLite::InternalWriteMessageToArray(number,value,deterministic,target);
      return puVar2;
    case TYPE_BYTES:
      puVar2 = WireFormatLite::WriteBytesToArray(number,(this->field_0).string_value,target);
      return puVar2;
    case TYPE_UINT32:
      puVar2 = WireFormatLite::WriteUInt32ToArray(number,(this->field_0).uint32_value,target);
      return puVar2;
    case TYPE_ENUM:
      puVar2 = WireFormatLite::WriteEnumToArray(number,(this->field_0).enum_value,target);
      return puVar2;
    case TYPE_SFIXED32:
      puVar2 = WireFormatLite::WriteSFixed32ToArray(number,(this->field_0).int32_value,target);
      return puVar2;
    case TYPE_SFIXED64:
      puVar2 = WireFormatLite::WriteSFixed64ToArray(number,(this->field_0).int64_value,target);
      return puVar2;
    case TYPE_SINT32:
      puVar2 = WireFormatLite::WriteSInt32ToArray(number,(this->field_0).int32_value,target);
      return puVar2;
    case MAX_TYPE:
      puVar2 = WireFormatLite::WriteSInt64ToArray(number,(this->field_0).int64_value,target);
      return puVar2;
    }
  }
  return (uint8 *)(double *)target;
}

Assistant:

uint8* ExtensionSet::Extension::InternalSerializeFieldWithCachedSizesToArray(
    int number, bool deterministic, uint8* target) const {
  if (is_repeated) {
    if (is_packed) {
      if (cached_size == 0) return target;

      target = WireFormatLite::WriteTagToArray(number,
          WireFormatLite::WIRETYPE_LENGTH_DELIMITED, target);
      target = WireFormatLite::WriteInt32NoTagToArray(cached_size, target);

      switch (real_type(type)) {
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, LOWERCASE)                        \
        case FieldDescriptor::TYPE_##UPPERCASE:                             \
          for (int i = 0; i < repeated_##LOWERCASE##_value->size(); i++) {  \
            target = WireFormatLite::Write##CAMELCASE##NoTagToArray(        \
              repeated_##LOWERCASE##_value->Get(i), target);                \
          }                                                                 \
          break

        HANDLE_TYPE(   INT32,    Int32,   int32);
        HANDLE_TYPE(   INT64,    Int64,   int64);
        HANDLE_TYPE(  UINT32,   UInt32,  uint32);
        HANDLE_TYPE(  UINT64,   UInt64,  uint64);
        HANDLE_TYPE(  SINT32,   SInt32,   int32);
        HANDLE_TYPE(  SINT64,   SInt64,   int64);
        HANDLE_TYPE( FIXED32,  Fixed32,  uint32);
        HANDLE_TYPE( FIXED64,  Fixed64,  uint64);
        HANDLE_TYPE(SFIXED32, SFixed32,   int32);
        HANDLE_TYPE(SFIXED64, SFixed64,   int64);
        HANDLE_TYPE(   FLOAT,    Float,   float);
        HANDLE_TYPE(  DOUBLE,   Double,  double);
        HANDLE_TYPE(    BOOL,     Bool,    bool);
        HANDLE_TYPE(    ENUM,     Enum,    enum);
#undef HANDLE_TYPE

        case WireFormatLite::TYPE_STRING:
        case WireFormatLite::TYPE_BYTES:
        case WireFormatLite::TYPE_GROUP:
        case WireFormatLite::TYPE_MESSAGE:
          GOOGLE_LOG(FATAL) << "Non-primitive types can't be packed.";
          break;
      }
    } else {
      switch (real_type(type)) {
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, LOWERCASE)                        \
        case FieldDescriptor::TYPE_##UPPERCASE:                             \
          for (int i = 0; i < repeated_##LOWERCASE##_value->size(); i++) {  \
            target = WireFormatLite::Write##CAMELCASE##ToArray(number,      \
              repeated_##LOWERCASE##_value->Get(i), target);                \
          }                                                                 \
          break

        HANDLE_TYPE(   INT32,    Int32,   int32);
        HANDLE_TYPE(   INT64,    Int64,   int64);
        HANDLE_TYPE(  UINT32,   UInt32,  uint32);
        HANDLE_TYPE(  UINT64,   UInt64,  uint64);
        HANDLE_TYPE(  SINT32,   SInt32,   int32);
        HANDLE_TYPE(  SINT64,   SInt64,   int64);
        HANDLE_TYPE( FIXED32,  Fixed32,  uint32);
        HANDLE_TYPE( FIXED64,  Fixed64,  uint64);
        HANDLE_TYPE(SFIXED32, SFixed32,   int32);
        HANDLE_TYPE(SFIXED64, SFixed64,   int64);
        HANDLE_TYPE(   FLOAT,    Float,   float);
        HANDLE_TYPE(  DOUBLE,   Double,  double);
        HANDLE_TYPE(    BOOL,     Bool,    bool);
        HANDLE_TYPE(  STRING,   String,  string);
        HANDLE_TYPE(   BYTES,    Bytes,  string);
        HANDLE_TYPE(    ENUM,     Enum,    enum);
#undef HANDLE_TYPE
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, LOWERCASE)                        \
        case FieldDescriptor::TYPE_##UPPERCASE:                             \
          for (int i = 0; i < repeated_##LOWERCASE##_value->size(); i++) {  \
            target = WireFormatLite::InternalWrite##CAMELCASE##ToArray(     \
                      number, repeated_##LOWERCASE##_value->Get(i),         \
                      deterministic, target);                               \
          }                                                                 \
          break

        HANDLE_TYPE(   GROUP,    Group, message);
        HANDLE_TYPE( MESSAGE,  Message, message);
#undef HANDLE_TYPE
      }
    }
  } else if (!is_cleared) {
    switch (real_type(type)) {
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, VALUE)                 \
      case FieldDescriptor::TYPE_##UPPERCASE:                    \
        target = WireFormatLite::Write##CAMELCASE##ToArray(      \
            number, VALUE, target); \
        break

      HANDLE_TYPE(   INT32,    Int32,    int32_value);
      HANDLE_TYPE(   INT64,    Int64,    int64_value);
      HANDLE_TYPE(  UINT32,   UInt32,   uint32_value);
      HANDLE_TYPE(  UINT64,   UInt64,   uint64_value);
      HANDLE_TYPE(  SINT32,   SInt32,    int32_value);
      HANDLE_TYPE(  SINT64,   SInt64,    int64_value);
      HANDLE_TYPE( FIXED32,  Fixed32,   uint32_value);
      HANDLE_TYPE( FIXED64,  Fixed64,   uint64_value);
      HANDLE_TYPE(SFIXED32, SFixed32,    int32_value);
      HANDLE_TYPE(SFIXED64, SFixed64,    int64_value);
      HANDLE_TYPE(   FLOAT,    Float,    float_value);
      HANDLE_TYPE(  DOUBLE,   Double,   double_value);
      HANDLE_TYPE(    BOOL,     Bool,     bool_value);
      HANDLE_TYPE(  STRING,   String,  *string_value);
      HANDLE_TYPE(   BYTES,    Bytes,  *string_value);
      HANDLE_TYPE(    ENUM,     Enum,     enum_value);
      HANDLE_TYPE(   GROUP,    Group, *message_value);
#undef HANDLE_TYPE
      case FieldDescriptor::TYPE_MESSAGE:
        if (is_lazy) {
          target = lazymessage_value->InternalWriteMessageToArray(
              number, deterministic, target);
        } else {
          target = WireFormatLite::InternalWriteMessageToArray(
              number, *message_value, deterministic, target);
        }
        break;
    }
  }
  return target;
}